

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O2

void wabt::RenameToIdentifiers<wabt::Export>
               (vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *things,BindingHash *bh,
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *filter)

{
  pointer ppEVar1;
  Index i;
  pointer ppEVar2;
  
  ppEVar1 = (things->super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  i = 0;
  for (ppEVar2 = (things->super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1
      ) {
    RenameToIdentifier(&(*ppEVar2)->name,i,bh,filter);
    i = i + 1;
  }
  return;
}

Assistant:

void RenameToIdentifiers(std::vector<T*>& things,
                         BindingHash& bh,
                         const std::set<std::string_view>* filter) {
  Index i = 0;
  for (auto thing : things) {
    RenameToIdentifier(thing->name, i++, bh, filter);
  }
}